

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::hasIOS12NewNeuralNetworkLayers(Model *model)

{
  int iVar1;
  LayerCase LVar2;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  NeuralNetworkLayer *this_00;
  NeuralNetworkLayer *layer;
  int i;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers;
  Model *model_local;
  
  this = getNNSpec(model);
  if (this != (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)0x0) {
    for (layer._4_4_ = 0;
        iVar1 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::size
                          (this), layer._4_4_ < iVar1; layer._4_4_ = layer._4_4_ + 1) {
      this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
                operator[](this,layer._4_4_);
      LVar2 = Specification::NeuralNetworkLayer::layer_case(this_00);
      if (LVar2 == kResizeBilinear) {
        return true;
      }
      LVar2 = Specification::NeuralNetworkLayer::layer_case(this_00);
      if (LVar2 == kCropResize) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CoreML::hasIOS12NewNeuralNetworkLayers(const Specification::Model& model) {

    // Return True if the model has the two new NN layers added in iOS 12, which are
    // resizeBilinear and CropResize

    auto layers = getNNSpec(model);
    if (layers) {
        for (int i=0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if (layer.layer_case() == Specification::NeuralNetworkLayer::kResizeBilinear) {
                return true;
            }
            if (layer.layer_case() == Specification::NeuralNetworkLayer::kCropResize) {
                return true;
            }
        }
    }
    return false;
}